

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O1

void * ZIP_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  PHYSFS_Io *io_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  PHYSFS_sint64 PVar4;
  ZIPinfo *info_00;
  ulong uVar5;
  ZIPentry *pZVar6;
  ulong uVar7;
  ZIPinfo *info;
  PHYSFS_ErrorCode errcode;
  PHYSFS_uint64 PVar8;
  PHYSFS_uint64 ofs_fixup;
  bool bVar9;
  PHYSFS_uint16 ui16;
  PHYSFS_uint16 entryCount16;
  PHYSFS_uint32 sig;
  PHYSFS_uint32 ui32;
  PHYSFS_uint64 cdir_ofs;
  PHYSFS_uint64 count;
  ushort local_5e;
  PHYSFS_uint32 local_5c;
  undefined8 local_58;
  uint local_4c;
  PHYSFS_uint64 local_48;
  ulong local_40;
  long local_38;
  
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/icculus[P]physfs/src/physfs_archiver_zip.c"
                  ,0x5c6,"void *ZIP_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting != 0) {
    errcode = PHYSFS_ERR_READ_ONLY;
LAB_00115f58:
    PHYSFS_setErrorCode(errcode);
    return (void *)0x0;
  }
  local_58._0_4_ = 0;
  iVar2 = readui32(io,(PHYSFS_uint32 *)&local_58);
  if (iVar2 == 0) {
    return (void *)0x0;
  }
  bVar9 = (uint)local_58 == 0x4034b50;
  if (!bVar9) {
    PVar4 = zip_find_end_of_central_dir(io,(PHYSFS_sint64 *)0x0);
    bVar9 = PVar4 != -1;
  }
  if (!bVar9) {
    return (void *)0x0;
  }
  *claimed = 1;
  info_00 = (ZIPinfo *)(*__PHYSFS_AllocatorHooks.Malloc)(0x38);
  if (info_00 == (ZIPinfo *)0x0) {
    errcode = PHYSFS_ERR_OUT_OF_MEMORY;
    goto LAB_00115f58;
  }
  (info_00->tree).case_sensitive = 0;
  (info_00->tree).only_usascii = 0;
  info_00->io = (PHYSFS_Io *)0x0;
  (info_00->tree).hashBuckets = 0;
  (info_00->tree).entrylen = 0;
  (info_00->tree).root = (__PHYSFS_DirTreeEntry *)0x0;
  (info_00->tree).hash = (__PHYSFS_DirTreeEntry **)0x0;
  info_00->zip64 = 0;
  info_00->has_crypto = 0;
  info_00->io = io;
  uVar5 = zip_find_end_of_central_dir(io,&local_38);
  if (((uVar5 == 0xffffffffffffffff) || (iVar2 = (*io->seek)(io,uVar5), iVar2 == 0)) ||
     (iVar2 = readui32(io,&local_4c), iVar2 == 0)) {
    ofs_fixup = 0;
  }
  else {
    ofs_fixup = 0;
    if (local_4c == 0x6054b50) {
      bVar9 = true;
      if ((long)uVar5 < 0x14) {
        ofs_fixup = 0;
        bVar1 = false;
        iVar2 = 0;
        goto LAB_00116188;
      }
      io_00 = info_00->io;
      iVar2 = (*io_00->seek)(io_00,uVar5 - 0x14);
      if ((iVar2 == 0) || (iVar2 = readui32(io_00,&local_5c), iVar2 == 0)) goto LAB_0011616a;
      iVar2 = 0;
      if (local_5c == 0x7064b50) {
        info_00->zip64 = 1;
        iVar3 = readui32(io_00,&local_5c);
        bVar9 = true;
        if (iVar3 == 0) {
          ofs_fixup = 0;
          bVar1 = false;
        }
        else {
          if (local_5c == 0) {
            iVar2 = readui64(io_00,&local_58);
            if ((iVar2 == 0) || (iVar2 = readui32(io_00,&local_5c), iVar2 == 0)) goto LAB_0011616a;
            if (local_5c != 1) goto LAB_00116160;
            PVar8 = CONCAT44(local_58._4_4_,(uint)local_58);
            uVar7 = zip64_find_end_of_central_dir(io_00,uVar5 - 0x14,PVar8);
            if ((long)uVar7 < 0) goto LAB_0011616a;
            ofs_fixup = uVar7 - PVar8;
            if (uVar7 < PVar8) {
              __assert_fail("((PHYSFS_uint64) pos) >= ui64",
                            "/workspace/llm4binary/github/license_c_cmakelists/icculus[P]physfs/src/physfs_archiver_zip.c"
                            ,0x521,
                            "int zip64_parse_end_of_central_dir(ZIPinfo *, PHYSFS_uint64 *, PHYSFS_uint64 *, PHYSFS_uint64 *, PHYSFS_sint64)"
                           );
            }
            iVar2 = (*io_00->seek)(io_00,uVar7);
            if ((iVar2 == 0) || (iVar2 = readui32(io_00,&local_5c), iVar2 == 0)) goto LAB_0011616d;
            if (local_5c != 0x6064b50) {
LAB_001163a5:
              PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
              goto LAB_0011616d;
            }
            iVar2 = readui64(io_00,&local_58);
            if ((((iVar2 == 0) || (iVar2 = readui16(io_00,&local_5e), iVar2 == 0)) ||
                (iVar2 = readui16(io_00,&local_5e), iVar2 == 0)) ||
               (iVar2 = readui32(io_00,&local_5c), iVar2 == 0)) goto LAB_0011616d;
            if (local_5c != 0) goto LAB_001163a5;
            iVar2 = readui32(io_00,&local_5c);
            if (iVar2 == 0) goto LAB_0011616d;
            if (local_5c != 0) goto LAB_001163a5;
            iVar2 = readui64(io_00,&local_58);
            if ((iVar2 == 0) || (iVar2 = readui64(io_00,&local_40), iVar2 == 0)) goto LAB_0011616d;
            if (CONCAT44(local_58._4_4_,(uint)local_58) != local_40) goto LAB_001163a5;
            iVar2 = readui64(io_00,&local_58);
            if ((iVar2 == 0) || (iVar2 = readui64(io_00,&local_48), iVar2 == 0)) goto LAB_0011616d;
            local_48 = local_48 + ofs_fixup;
            iVar2 = 1;
          }
          else {
LAB_00116160:
            PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
LAB_0011616a:
            ofs_fixup = 0;
LAB_0011616d:
            iVar2 = 0;
          }
          bVar1 = false;
          bVar9 = true;
        }
      }
      else {
        iVar2 = -1;
        bVar1 = true;
        ofs_fixup = 0;
        bVar9 = false;
      }
LAB_00116188:
      if (bVar9) goto LAB_00116047;
      if (!bVar1) {
        __assert_fail("rc == -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/icculus[P]physfs/src/physfs_archiver_zip.c"
                      ,0x574,
                      "int zip_parse_end_of_central_dir(ZIPinfo *, PHYSFS_uint64 *, PHYSFS_uint64 *, PHYSFS_uint64 *)"
                     );
      }
      iVar3 = (*io->seek)(io,uVar5 + 4);
      iVar2 = 0;
      if ((iVar3 == 0) || (iVar3 = readui16(io,&local_5e), iVar3 == 0)) goto LAB_00116047;
      if (local_5e == 0) {
        iVar3 = readui16(io,&local_5e);
        if (iVar3 == 0) goto LAB_00116047;
        if (local_5e == 0) {
          iVar3 = readui16(io,&local_5e);
          if ((iVar3 == 0) || (iVar3 = readui16(io,(PHYSFS_uint16 *)&local_5c), iVar3 == 0))
          goto LAB_00116047;
          if (local_5e == (ushort)local_5c) {
            local_40 = (ulong)(ushort)local_5c;
            iVar3 = readui32(io,&local_4c);
            if ((iVar3 == 0) || (iVar3 = readui32(io,(PHYSFS_uint32 *)&local_58), iVar3 == 0))
            goto LAB_00116047;
            local_48 = (PHYSFS_uint64)(uint)local_58;
            PVar8 = uVar5 - (local_4c + local_48);
            if (local_4c + local_48 <= uVar5) {
              local_48 = local_48 + PVar8;
              iVar3 = readui16(io,&local_5e);
              ofs_fixup = PVar8;
              if ((iVar3 == 0) || (iVar2 = 1, local_5e + uVar5 + 0x16 == local_38))
              goto LAB_00116047;
            }
          }
        }
      }
    }
    PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
  }
  iVar2 = 0;
LAB_00116047:
  if ((iVar2 != 0) &&
     (iVar2 = __PHYSFS_DirTreeInit((__PHYSFS_DirTree *)info_00,0x70,1,0), uVar5 = local_40,
     iVar2 != 0)) {
    *(undefined4 *)&(info_00->tree).root[1].hashnext = 4;
    iVar2 = info_00->zip64;
    iVar3 = (*info_00->io->seek)(info_00->io,local_48);
    if (iVar3 != 0) {
      while( true ) {
        if (uVar5 == 0) {
          if (((info_00->tree).root)->sibling != (__PHYSFS_DirTreeEntry *)0x0) {
            __assert_fail("info->tree.root->sibling == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/icculus[P]physfs/src/physfs_archiver_zip.c"
                          ,0x5de,"void *ZIP_openArchive(PHYSFS_Io *, const char *, int, int *)");
          }
          return info_00;
        }
        pZVar6 = zip_load_entry(info_00,iVar2,ofs_fixup);
        if (pZVar6 == (ZIPentry *)0x0) break;
        if ((pZVar6->general_bits & 1) != 0) {
          info_00->has_crypto = 1;
        }
        uVar5 = uVar5 - 1;
      }
    }
  }
  info_00->io = (PHYSFS_Io *)0x0;
  __PHYSFS_DirTreeDeinit((__PHYSFS_DirTree *)info_00);
  (*__PHYSFS_AllocatorHooks.Free)(info_00);
  return (void *)0x0;
}

Assistant:

static void *ZIP_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    ZIPinfo *info = NULL;
    ZIPentry *root = NULL;
    PHYSFS_uint64 dstart = 0;  /* data start */
    PHYSFS_uint64 cdir_ofs;  /* central dir offset */
    PHYSFS_uint64 count;

    assert(io != NULL);  /* shouldn't ever happen. */

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);
    BAIL_IF_ERRPASS(!isZip(io), NULL);

    *claimed = 1;

    info = (ZIPinfo *) allocator.Malloc(sizeof (ZIPinfo));
    BAIL_IF(!info, PHYSFS_ERR_OUT_OF_MEMORY, NULL);
    memset(info, '\0', sizeof (ZIPinfo));

    info->io = io;

    if (!zip_parse_end_of_central_dir(info, &dstart, &cdir_ofs, &count))
        goto ZIP_openarchive_failed;
    else if (!__PHYSFS_DirTreeInit(&info->tree, sizeof (ZIPentry), 1, 0))
        goto ZIP_openarchive_failed;

    root = (ZIPentry *) info->tree.root;
    root->resolved = ZIP_DIRECTORY;

    if (!zip_load_entries(info, dstart, cdir_ofs, count))
        goto ZIP_openarchive_failed;

    assert(info->tree.root->sibling == NULL);
    return info;

ZIP_openarchive_failed:
    info->io = NULL;  /* don't let ZIP_closeArchive destroy (io). */
    ZIP_closeArchive(info);
    return NULL;
}